

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O2

QOpenGLFunctionsPrivateEx * qt_gl_functions(QOpenGLContext *context)

{
  int iVar1;
  QOpenGLFunctionsPrivateEx *pQVar2;
  
  if (context == (QOpenGLContext *)0x0) {
    context = QOpenGLContext::currentContext();
  }
  if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_gl_functions_resource>>::
      instance()::holder == '\0') {
    iVar1 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_gl_functions_resource>>
                                 ::instance()::holder);
    if (iVar1 != 0) {
      QOpenGLMultiGroupSharedResource::QOpenGLMultiGroupSharedResource
                ((QOpenGLMultiGroupSharedResource *)
                 QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_gl_functions_resource>>
                 ::instance()::holder);
      QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_gl_functions_resource>::guard._q_value.
      super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xff;
      __cxa_atexit(QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_gl_functions_resource>::
                   ~Holder,QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_gl_functions_resource>>
                           ::instance()::holder,&__dso_handle);
      __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_gl_functions_resource>>
                           ::instance()::holder);
    }
  }
  pQVar2 = QOpenGLMultiGroupSharedResource::value<QOpenGLFunctionsPrivateEx>
                     ((QOpenGLMultiGroupSharedResource *)
                      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_gl_functions_resource>>
                      ::instance()::holder,context);
  return pQVar2;
}

Assistant:

static QOpenGLFunctionsPrivateEx *qt_gl_functions(QOpenGLContext *context = nullptr)
{
    if (!context)
        context = QOpenGLContext::currentContext();
    Q_ASSERT(context);
    QOpenGLFunctionsPrivateEx *funcs =
        qt_gl_functions_resource()->value<QOpenGLFunctionsPrivateEx>(context);
    return funcs;
}